

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vl53l0x.cpp
# Opt level: O0

uint8_t __thiscall VL53L0X::getVcselPulsePeriod(VL53L0X *this,vl53l0xVcselPeriodType type)

{
  uint8_t uVar1;
  vl53l0xVcselPeriodType type_local;
  VL53L0X *this_local;
  
  if (type == VcselPeriodPreRange) {
    uVar1 = readRegister(this,'P');
    this_local._7_1_ = (uVar1 + '\x01') * '\x02';
  }
  else if (type == VcselPeriodFinalRange) {
    uVar1 = readRegister(this,'p');
    this_local._7_1_ = (uVar1 + '\x01') * '\x02';
  }
  else {
    this_local._7_1_ = 0xff;
  }
  return this_local._7_1_;
}

Assistant:

uint8_t VL53L0X::getVcselPulsePeriod(vl53l0xVcselPeriodType type) {
	if (type == VcselPeriodPreRange) {
		return decodeVcselPeriod(this->readRegister(PRE_RANGE_CONFIG_VCSEL_PERIOD));
	} else if (type == VcselPeriodFinalRange) {
		return decodeVcselPeriod(this->readRegister(FINAL_RANGE_CONFIG_VCSEL_PERIOD));
	} else {
		return 255;
	}
}